

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling.cpp
# Opt level: O0

optional<QByteArray> * qEnvironmentVariableOptionalByteArray(char *name)

{
  bool bVar1;
  optional<QByteArray> *in_RDI;
  long in_FS_OFFSET;
  QByteArray value;
  optional<QByteArray> *this;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  qgetenv((char *)&local_20);
  bVar1 = QByteArray::isNull((QByteArray *)0x391815);
  if (bVar1) {
    std::optional<QByteArray>::optional(in_RDI);
  }
  else {
    std::optional<QByteArray>::optional<QByteArray,_true>(this,(QByteArray *)in_RDI);
  }
  QByteArray::~QByteArray((QByteArray *)0x39183e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

static std::optional<QByteArray> qEnvironmentVariableOptionalByteArray(const char *name)
{
    QByteArray value = qgetenv(name);
    return value.isNull() ? std::nullopt : std::optional(std::move(value));
}